

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O2

void __thiscall
ServerSocketUDP::ServerSocketUDP(ServerSocketUDP *this,int domain,int type,int protocol,int port)

{
  ostream *poVar1;
  
  this->portNumber = port;
  this->serverSocketFD = -1;
  socketServer(this,domain,type,protocol);
  bindServer(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Binding successfully done....");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

ServerSocketUDP::ServerSocketUDP(int domain, int type, int protocol, int port) {
    this->portNumber = port;
    this->serverSocketFD = -1;  //FD: file descriptor 文件描述符
    this->socketServer(domain, type, protocol);
    if (this->bindServer() > 0) {
        cout << "Binding successfully done...." << endl;
    }
}